

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue val;
  JSValue v_00;
  JSValue JVar1;
  int iVar2;
  int in_ECX;
  JSValueUnion in_RDI;
  JSValue *in_R8;
  JSValue JVar3;
  JSValue JVar4;
  uint32_t len;
  int i;
  JSValue obj;
  JSValue v;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  JSValueUnion in_stack_fffffffffffffef8;
  JSValueUnion in_stack_ffffffffffffff00;
  JSValue in_stack_ffffffffffffff08;
  JSValueUnion in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  JSValue in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  int local_ac;
  undefined4 local_a8;
  int in_stack_ffffffffffffff5c;
  undefined4 uVar5;
  JSContext *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 local_70;
  undefined4 uStack_6c;
  int64_t local_68;
  
  JVar3.tag._0_4_ = in_stack_ffffffffffffff70;
  JVar3.u.ptr = in_R8;
  JVar3.tag._4_4_ = in_ECX;
  JVar3 = js_create_from_ctor(in_stack_ffffffffffffff60,JVar3,in_stack_ffffffffffffff5c);
  local_a8 = JVar3.u._0_4_;
  uVar5 = JVar3.u._4_4_;
  local_68 = JVar3.tag;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 != 0) {
    local_70 = local_a8;
    uStack_6c = uVar5;
    goto LAB_0014f1f1;
  }
  if ((in_ECX == 1) && (iVar2 = JS_IsNumber(*in_R8), iVar2 != 0)) {
    in_stack_ffffffffffffff00 = in_RDI;
    JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,*in_R8);
    iVar2 = JS_ToArrayLengthFree
                      ((JSContext *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (uint32_t *)JVar4.tag,JVar3,JVar4.u._4_4_);
    if (iVar2 == 0) {
      in_stack_fffffffffffffef8 = in_RDI;
      if (0x7fffffff < in_stack_ffffffffffffff3c) {
        __JS_NewFloat64((JSContext *)in_RDI.ptr,(double)in_stack_ffffffffffffff3c);
        in_stack_fffffffffffffef8 = in_RDI;
      }
      val.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
      val.u.ptr = in_stack_fffffffffffffef8.ptr;
      iVar2 = JS_SetProperty((JSContext *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             in_stack_ffffffffffffff08,
                             (JSAtom)((ulong)in_stack_fffffffffffffee8 >> 0x20),val);
      if (-1 < iVar2) goto LAB_0014f1a7;
    }
LAB_0014f1c3:
    v_00.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
    v_00.u.float64 = in_stack_fffffffffffffef8.float64;
    JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),v_00);
    local_70 = 0;
    local_68 = 6;
  }
  else {
    for (local_ac = 0; local_ac < in_ECX; local_ac = local_ac + 1) {
      in_stack_fffffffffffffef4 = local_ac;
      JVar3 = JS_DupValue((JSContext *)in_RDI.ptr,in_R8[local_ac]);
      JVar4.tag = in_stack_ffffffffffffff20;
      JVar4.u.float64 = in_stack_ffffffffffffff18.float64;
      iVar2 = JS_SetPropertyUint32
                        ((JSContext *)JVar3.tag,in_stack_ffffffffffffff28,JVar3.u._4_4_,JVar4);
      if (iVar2 < 0) goto LAB_0014f1c3;
    }
LAB_0014f1a7:
    local_70 = local_a8;
    uStack_6c = uVar5;
  }
LAB_0014f1f1:
  JVar1.u._4_4_ = uStack_6c;
  JVar1.u.int32 = local_70;
  JVar1.tag = local_68;
  return JVar1;
}

Assistant:

static JSValue js_array_constructor(JSContext *ctx, JSValueConst new_target,
                                    int argc, JSValueConst *argv)
{
    JSValue obj;
    int i;

    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_ARRAY);
    if (JS_IsException(obj))
        return obj;
    if (argc == 1 && JS_IsNumber(argv[0])) {
        uint32_t len;
        if (JS_ToArrayLengthFree(ctx, &len, JS_DupValue(ctx, argv[0]), TRUE))
            goto fail;
        if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewUint32(ctx, len)) < 0)
            goto fail;
    } else {
        for(i = 0; i < argc; i++) {
            if (JS_SetPropertyUint32(ctx, obj, i, JS_DupValue(ctx, argv[i])) < 0)
                goto fail;
        }
    }
    return obj;
fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}